

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long mkvparser::VideoTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               VideoTrack **pResult)

{
  IMkvReader *pReader;
  _Head_base<0UL,_mkvparser::Projection_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  longlong lVar4;
  VideoTrack *pVVar5;
  pointer __old_p;
  Colour *this;
  Colour *pCVar6;
  long lVar7;
  long lVar8;
  longlong pos;
  longlong size;
  Projection *projection;
  char *colour_space;
  double rate;
  longlong id;
  longlong local_c8;
  longlong local_c0;
  Colour *local_b8;
  _Head_base<0UL,_mkvparser::Projection_*,_false> local_b0;
  longlong local_a8;
  longlong local_a0;
  longlong local_98;
  longlong local_90;
  longlong local_88;
  longlong local_80;
  double local_78;
  Colour *local_70;
  char *local_68;
  double local_60;
  VideoTrack **local_58;
  Segment *local_50;
  longlong local_48;
  longlong local_40;
  long local_38;
  
  lVar8 = -1;
  if ((*pResult == (VideoTrack *)0x0) && (info->type == 1)) {
    local_60 = 0.0;
    local_68 = (char *)0x0;
    local_c8 = (info->settings).start;
    if (local_c8 < 0) {
      __assert_fail("s.start >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x14cf,
                    "static long mkvparser::VideoTrack::Parse(Segment *, const Info &, long long, long long, VideoTrack *&)"
                   );
    }
    lVar7 = (info->settings).size;
    local_58 = pResult;
    local_48 = element_start;
    local_40 = element_size;
    if (lVar7 < 0) {
      __assert_fail("s.size >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x14d0,
                    "static long mkvparser::VideoTrack::Parse(Segment *, const Info &, long long, long long, VideoTrack *&)"
                   );
    }
    pReader = pSegment->m_pReader;
    lVar7 = lVar7 + local_c8;
    local_70 = (Colour *)0x0;
    local_b0._M_head_impl = (Projection *)0x0;
    local_78 = 0.0;
    local_80 = 0;
    local_88 = 0;
    local_90 = 0;
    local_98 = 0;
    local_a0 = 0;
    local_a8 = 0;
    this = (Colour *)0x0;
    local_50 = pSegment;
    do {
      if (lVar7 <= local_c8) {
        lVar8 = -2;
        if (local_c8 == lVar7) {
          pVVar5 = (VideoTrack *)operator_new(0x110,(nothrow_t *)&std::nothrow);
          lVar8 = -1;
          if (pVVar5 != (VideoTrack *)0x0) {
            (pVVar5->super_Track).m_pSegment = local_50;
            (pVVar5->super_Track).m_element_start = local_48;
            (pVVar5->super_Track).m_element_size = local_40;
            (pVVar5->super_Track).m_info.uid = 0;
            (pVVar5->super_Track).m_info.defaultDuration = 0;
            (pVVar5->super_Track).m_info.codecDelay = 0;
            (pVVar5->super_Track).m_info.seekPreRoll = 0;
            (pVVar5->super_Track).m_info.nameAsUTF8 = (char *)0x0;
            (pVVar5->super_Track).m_info.language = (char *)0x0;
            (pVVar5->super_Track).m_info.codecId = (char *)0x0;
            (pVVar5->super_Track).m_info.codecNameAsUTF8 = (char *)0x0;
            (pVVar5->super_Track).m_info.codecPrivate = (uchar *)0x0;
            (pVVar5->super_Track).m_info.codecPrivateSize = 0;
            (pVVar5->super_Track).m_info.lacing = false;
            (pVVar5->super_Track).m_eos.super_BlockEntry.m_pCluster = (Cluster *)0x0;
            (pVVar5->super_Track).m_eos.super_BlockEntry.m_index = -0x8000000000000000;
            (pVVar5->super_Track).m_eos.super_BlockEntry._vptr_BlockEntry =
                 (_func_int **)&PTR__BlockEntry_00124bb8;
            (pVVar5->super_Track).content_encoding_entries_ = (ContentEncoding **)0x0;
            (pVVar5->super_Track).content_encoding_entries_end_ = (ContentEncoding **)0x0;
            (pVVar5->super_Track)._vptr_Track = (_func_int **)&PTR__VideoTrack_00124be8;
            pVVar5->m_colour_space = (char *)0x0;
            pVVar5->m_colour = (Colour *)0x0;
            pVVar5->m_projection = (Projection *)0x0;
            iVar3 = Track::Info::Copy(info,&(pVVar5->super_Track).m_info);
            if (iVar3 == 0) {
              pVVar5->m_width = local_a8;
              pVVar5->m_height = local_a0;
              pVVar5->m_display_width = local_98;
              pVVar5->m_display_height = local_90;
              pVVar5->m_display_unit = local_88;
              pVVar5->m_stereo_mode = local_80;
              pVVar5->m_rate = local_78;
              pVVar5->m_colour = this;
              pVVar5->m_colour_space = local_68;
              pVVar5->m_projection = local_b0._M_head_impl;
              *local_58 = pVVar5;
              return 0;
            }
            (*(pVVar5->super_Track)._vptr_Track[1])(pVVar5);
          }
        }
        goto LAB_0011853a;
      }
      lVar8 = ParseElementHeader(pReader,&local_c8,lVar7,&local_38,&local_c0);
      if (lVar8 < 0) goto LAB_0011853a;
      pCVar6 = this;
      if (local_38 < 0x54ba) {
        if (local_38 < 0x53b8) {
          if (local_38 == 0xb0) {
            local_a8 = UnserializeUInt(pReader,local_c8,local_c0);
            lVar4 = local_a8;
joined_r0x00118377:
            if (lVar4 < 1) break;
          }
          else if (local_38 == 0xba) {
            local_a0 = UnserializeUInt(pReader,local_c8,local_c0);
            lVar4 = local_a0;
            goto joined_r0x001182c3;
          }
        }
        else {
          if (local_38 == 0x53b8) {
            local_80 = UnserializeUInt(pReader,local_c8,local_c0);
            lVar4 = local_80;
          }
          else {
            if (local_38 == 0x54b0) {
              local_98 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar4 = local_98;
joined_r0x001182c3:
              if (0 < lVar4) goto LAB_00118435;
              break;
            }
            if (local_38 != 0x54b2) goto LAB_00118435;
            local_88 = UnserializeUInt(pReader,local_c8,local_c0);
            lVar4 = local_88;
          }
          if (lVar4 < 0) break;
        }
      }
      else if (local_38 < 0x7670) {
        if (local_38 == 0x54ba) {
          local_90 = UnserializeUInt(pReader,local_c8,local_c0);
          lVar4 = local_90;
          goto joined_r0x00118377;
        }
        if (local_38 == 0x55b0) {
          local_b8 = (Colour *)0x0;
          bVar2 = Colour::Parse(pReader,local_c8,local_c0,&local_b8);
          pCVar6 = local_b8;
          if (!bVar2) break;
          local_70 = local_b8;
          if (this != (Colour *)0x0) {
            Colour::~Colour(this);
            operator_delete(this);
          }
        }
      }
      else if (local_38 == 0x7670) {
        local_b8 = (Colour *)0x0;
        bVar2 = Projection::Parse(pReader,local_c8,local_c0,(Projection **)&local_b8);
        if (!bVar2) break;
        std::__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
        reset((__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> *
              )&local_b0,(pointer)local_b8);
      }
      else if (local_38 == 0x2383e3) {
        lVar8 = UnserializeFloat(pReader,local_c8,local_c0,&local_60);
        if (lVar8 < 0) goto LAB_0011853a;
        local_78 = local_60;
        if (local_60 <= 0.0) break;
      }
      else if ((local_38 == 0x2eb524) &&
              (lVar8 = UnserializeString(pReader,local_c8,local_c0,&local_68), lVar8 < 0))
      goto LAB_0011853a;
LAB_00118435:
      local_c8 = local_c8 + local_c0;
      this = pCVar6;
    } while (local_c8 <= lVar7);
    lVar8 = -2;
LAB_0011853a:
    _Var1._M_head_impl = local_b0._M_head_impl;
    if (local_b0._M_head_impl != (Projection *)0x0) {
      if ((local_b0._M_head_impl)->private_data != (uchar *)0x0) {
        operator_delete__((local_b0._M_head_impl)->private_data);
      }
      operator_delete(_Var1._M_head_impl);
    }
    if (this != (Colour *)0x0) {
      Colour::~Colour(this);
      operator_delete(this);
    }
  }
  return lVar8;
}

Assistant:

long VideoTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       VideoTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kVideo)
    return -1;

  long long width = 0;
  long long height = 0;
  long long display_width = 0;
  long long display_height = 0;
  long long display_unit = 0;
  long long stereo_mode = 0;

  double rate = 0.0;
  char* colour_space = NULL;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  std::unique_ptr<Colour> colour_ptr;
  std::unique_ptr<Projection> projection_ptr;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvPixelWidth) {
      width = UnserializeUInt(pReader, pos, size);

      if (width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvPixelHeight) {
      height = UnserializeUInt(pReader, pos, size);

      if (height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayWidth) {
      display_width = UnserializeUInt(pReader, pos, size);

      if (display_width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayHeight) {
      display_height = UnserializeUInt(pReader, pos, size);

      if (display_height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayUnit) {
      display_unit = UnserializeUInt(pReader, pos, size);

      if (display_unit < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvStereoMode) {
      stereo_mode = UnserializeUInt(pReader, pos, size);

      if (stereo_mode < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvFrameRate) {
      const long status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvColour) {
      Colour* colour = NULL;
      if (!Colour::Parse(pReader, pos, size, &colour)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        colour_ptr.reset(colour);
      }
    } else if (id == libwebm::kMkvProjection) {
      Projection* projection = NULL;
      if (!Projection::Parse(pReader, pos, size, &projection)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        projection_ptr.reset(projection);
      }
    } else if (id == libwebm::kMkvColourSpace) {
      const long status = UnserializeString(pReader, pos, size, colour_space);
      if (status < 0)
        return status;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  VideoTrack* const pTrack =
      new (std::nothrow) VideoTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pTrack->m_width = width;
  pTrack->m_height = height;
  pTrack->m_display_width = display_width;
  pTrack->m_display_height = display_height;
  pTrack->m_display_unit = display_unit;
  pTrack->m_stereo_mode = stereo_mode;
  pTrack->m_rate = rate;
  pTrack->m_colour = colour_ptr.release();
  pTrack->m_colour_space = colour_space;
  pTrack->m_projection = projection_ptr.release();

  pResult = pTrack;
  return 0;  // success
}